

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimplePathSuffixSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePathSuffixSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::NameSyntax> *args)

{
  SimplePathSuffixSyntax *pSVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_00000018;
  SimplePathSuffixSyntax *in_stack_00000020;
  
  pSVar1 = (SimplePathSuffixSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SimplePathSuffixSyntax::SimplePathSuffixSyntax(in_stack_00000020,in_stack_00000018)
  ;
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }